

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPlatformMisc.cpp
# Opt level: O0

Uint64 Diligent::LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)

{
  int iVar1;
  pthread_t __th;
  bool bVar2;
  size_t __cpu_1;
  Uint32 j_1;
  size_t __cpu;
  undefined1 local_a8 [4];
  Uint32 j;
  cpu_set_t CPUSet;
  Uint64 CurrAffinity;
  pthread_t CurrThread;
  Uint64 Mask_local;
  
  __th = pthread_self();
  CPUSet.__bits[0xf] = 0;
  iVar1 = pthread_getaffinity_np(__th,0x80,(cpu_set_t *)local_a8);
  if (iVar1 == 0) {
    for (__cpu._4_4_ = 0; __cpu._4_4_ < 0x40; __cpu._4_4_ = __cpu._4_4_ + 1) {
      if (__cpu._4_4_ >> 3 < 0x80) {
        bVar2 = (*(ulong *)(local_a8 + (ulong)(__cpu._4_4_ >> 6) * 8) &
                1L << ((byte)__cpu._4_4_ & 0x3f)) != 0;
      }
      else {
        bVar2 = false;
      }
      if (bVar2) {
        CPUSet.__bits[0xf] = 1L << ((byte)__cpu._4_4_ & 0x3f) | CPUSet.__bits[0xf];
      }
    }
  }
  memset(local_a8,0,0x80);
  for (__cpu_1._0_4_ = 0; (uint)__cpu_1 < 0x40; __cpu_1._0_4_ = (uint)__cpu_1 + 1) {
    if (((Mask & 1L << ((byte)(uint)__cpu_1 & 0x3f)) != 0) && ((uint)__cpu_1 >> 3 < 0x80)) {
      *(ulong *)(local_a8 + (ulong)((uint)__cpu_1 >> 6) * 8) =
           1L << ((byte)(uint)__cpu_1 & 0x3f) |
           *(ulong *)(local_a8 + (ulong)((uint)__cpu_1 >> 6) * 8);
    }
  }
  iVar1 = pthread_setaffinity_np(__th,0x80,(cpu_set_t *)local_a8);
  if (iVar1 == 0) {
    Mask_local = CPUSet.__bits[0xf];
  }
  else {
    Mask_local = 0;
  }
  return Mask_local;
}

Assistant:

Uint64 LinuxMisc::SetCurrentThreadAffinity(Uint64 Mask)
{
    const auto CurrThread = pthread_self();

    Uint64 CurrAffinity = 0;

    cpu_set_t CPUSet;
    if (pthread_getaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
    {
        for (Uint32 j = 0; j < 64; ++j)
        {
            if (CPU_ISSET(j, &CPUSet))
                CurrAffinity |= Uint64{1} << j;
        }
    }

    CPU_ZERO(&CPUSet);
    for (Uint32 j = 0; j < 64; j++)
    {
        if (Mask & (Uint64{1} << j))
            CPU_SET(j, &CPUSet);
    }

    if (pthread_setaffinity_np(CurrThread, sizeof(CPUSet), &CPUSet) == 0)
        return CurrAffinity;
    else
        return 0;
}